

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

_Bool set_flag_rps_bias_recovery_frame(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *in_RDI;
  int min_dist;
  _Bool local_1;
  
  if (((((in_RDI->ppi->rtc_ref).set_ref_frame_config == 0) ||
       ((in_RDI->svc).number_temporal_layers != 1)) || ((in_RDI->svc).number_spatial_layers != 1))
     || (((((in_RDI->ppi->rtc_ref).reference_was_previous_frame & 1U) == 0 ||
          (iVar1 = av1_svc_get_min_ref_dist(in_RDI), iVar1 == 0x7fffffff)) || (iVar1 < 5)))) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool set_flag_rps_bias_recovery_frame(const AV1_COMP *const cpi) {
  if (cpi->ppi->rtc_ref.set_ref_frame_config &&
      cpi->svc.number_temporal_layers == 1 &&
      cpi->svc.number_spatial_layers == 1 &&
      cpi->ppi->rtc_ref.reference_was_previous_frame) {
    int min_dist = av1_svc_get_min_ref_dist(cpi);
    // Only consider boost for this frame if its closest reference is further
    // than x frames away, using x = 4 for now.
    if (min_dist != INT_MAX && min_dist > 4) return true;
  }
  return false;
}